

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O0

Float<unsigned_short,_5,_10,_15,_3U>
tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
          (Float<unsigned_int,_8,_23,_127,_3U> *other)

{
  byte bVar1;
  bool bVar2;
  StorageType_conflict extraout_AX;
  ushort uVar3;
  uint uVar4;
  StorageType SVar5;
  int iVar6;
  ulong uVar7;
  size_t *in_RCX;
  uchar *sig;
  uchar *sig_00;
  uchar *sig_01;
  EVP_PKEY_CTX *in_RSI;
  Float<unsigned_int,_8,_23,_127,_3U> *__tagb;
  uchar *in_R8;
  size_t in_R9;
  deUint64 bias_1;
  deUint64 half_1;
  int bitDiff_1;
  deUint64 bias;
  deUint64 half;
  ushort uStack_30;
  int bitDiff;
  deUint64 m;
  int e;
  StorageType_conflict s;
  int eMax;
  int eMin;
  Float<unsigned_int,_8,_23,_127,_3U> *other_local;
  
  bVar2 = Float<unsigned_int,_8,_23,_127,_3U>::isInf(other);
  if (bVar2) {
    iVar6 = Float<unsigned_int,_8,_23,_127,_3U>::sign(other,in_RSI,sig,in_RCX,in_R8,in_R9);
    other_local._6_2_ = Float<unsigned_short,_5,_10,_15,_3U>::inf(iVar6);
  }
  else {
    __tagb = other;
    bVar2 = Float<unsigned_int,_8,_23,_127,_3U>::isNaN(other);
    if (bVar2) {
      Float<unsigned_short,_5,_10,_15,_3U>::nan((char *)__tagb);
      other_local._6_2_ = extraout_AX;
    }
    else {
      bVar2 = Float<unsigned_int,_8,_23,_127,_3U>::isZero(other);
      if (bVar2) {
        iVar6 = Float<unsigned_int,_8,_23,_127,_3U>::sign(other,in_RSI,sig_00,in_RCX,in_R8,in_R9);
        other_local._6_2_ = Float<unsigned_short,_5,_10,_15,_3U>::zero(iVar6);
      }
      else {
        uVar4 = Float<unsigned_int,_8,_23,_127,_3U>::signBit(other);
        uVar3 = (ushort)((uVar4 & 0xffff) << 0xf);
        m._0_4_ = Float<unsigned_int,_8,_23,_127,_3U>::exponent(other);
        SVar5 = Float<unsigned_int,_8,_23,_127,_3U>::mantissa(other);
        for (_uStack_30 = (ulong)SVar5; (_uStack_30 & 0x800000) == 0; _uStack_30 = _uStack_30 << 1)
        {
          m._0_4_ = (int)m + -1;
        }
        if ((int)m < -0xe) {
          if (-0xf - (int)m < 0xb) {
            bVar1 = -(char)(int)m - 1;
            Float<unsigned_short,_5,_10,_15,_3U>::Float
                      ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&other_local + 6),
                       uVar3 | (ushort)(_uStack_30 + (1L << (-(char)(int)m - 2U & 0x3f)) + -1 +
                                        (_uStack_30 >> (bVar1 & 0x3f) & 1) >> (bVar1 & 0x3f)));
          }
          else {
            iVar6 = Float<unsigned_int,_8,_23,_127,_3U>::sign
                              (other,in_RSI,sig_01,in_RCX,in_R8,in_R9);
            other_local._6_2_ = Float<unsigned_short,_5,_10,_15,_3U>::zero(iVar6);
          }
        }
        else {
          uVar7 = (_uStack_30 & 0xffffffffff7fffff) + 0xfff +
                  ((_uStack_30 & 0xffffffffff7fffff) >> 0xd & 1) >> 0xd;
          uStack_30 = (ushort)uVar7;
          if ((uVar7 & 0x400) != 0) {
            uStack_30 = 0;
            m._0_4_ = (int)m + 1;
          }
          if ((int)m < 0x10) {
            Float<unsigned_short,_5,_10,_15,_3U>::Float
                      ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&other_local + 6),
                       uVar3 | (ushort)(((int)m + 0xfU & 0xffff) << 10) | uStack_30);
          }
          else {
            iVar6 = Float<unsigned_int,_8,_23,_127,_3U>::sign
                              (other,in_RSI,sig_01,(size_t *)0xd,in_R8,in_R9);
            other_local._6_2_ = Float<unsigned_short,_5,_10,_15,_3U>::inf(iVar6);
          }
        }
      }
    }
  }
  return (Float<unsigned_short,_5,_10,_15,_3U>)other_local._6_2_;
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::convert
	(const Float<OtherStorageType, OtherExponentBits, OtherMantissaBits, OtherExponentBias, OtherFlags>& other)
{
	if (!(Flags & FLOAT_HAS_SIGN) && other.sign() < 0)
	{
		// Negative number, truncate to zero.
		return zero(+1);
	}
	else if (other.isInf())
	{
		return inf(other.sign());
	}
	else if (other.isNaN())
	{
		return nan();
	}
	else if (other.isZero())
	{
		return zero(other.sign());
	}
	else
	{
		const int			eMin	= 1 - ExponentBias;
		const int			eMax	= ((1<<ExponentBits)-2) - ExponentBias;

		const StorageType	s		= StorageType((StorageType(other.signBit())) << (StorageType(ExponentBits+MantissaBits))); // \note Not sign, but sign bit.
		int					e		= other.exponent();
		deUint64			m		= other.mantissa();

		// Normalize denormalized values prior to conversion.
		while (!(m & (1ull<<OtherMantissaBits)))
		{
			m <<= 1;
			e  -= 1;
		}

		if (e < eMin)
		{
			// Underflow.
			if ((Flags & FLOAT_SUPPORT_DENORM) && (eMin-e-1 <= MantissaBits))
			{
				// Shift and round (RTE).
				int			bitDiff	= (OtherMantissaBits-MantissaBits) + (eMin-e);
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				return Float(StorageType(s | (m + half + bias) >> bitDiff));
			}
			else
				return zero(other.sign());
		}
		else
		{
			// Remove leading 1.
			m = m & ~(1ull<<OtherMantissaBits);

			if (MantissaBits < OtherMantissaBits)
			{
				// Round mantissa (round to nearest even).
				int			bitDiff	= OtherMantissaBits-MantissaBits;
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				m = (m + half + bias) >> bitDiff;

				if (m & (1ull<<MantissaBits))
				{
					// Overflow in mantissa.
					m  = 0;
					e += 1;
				}
			}
			else
			{
				int bitDiff = MantissaBits-OtherMantissaBits;
				m = m << bitDiff;
			}

			if (e > eMax)
			{
				// Overflow.
				return inf(other.sign());
			}
			else
			{
				DE_ASSERT(de::inRange(e, eMin, eMax));
				DE_ASSERT(((e + ExponentBias) & ~((1ull<<ExponentBits)-1)) == 0);
				DE_ASSERT((m & ~((1ull<<MantissaBits)-1)) == 0);

				return Float(StorageType(s | (StorageType(e + ExponentBias) << MantissaBits) | m));
			}
		}
	}
}